

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O2

yyjson_mut_val *
duckdb_yyjson::yyjson_mut_patch
          (yyjson_mut_doc *doc,yyjson_mut_val *orig,yyjson_mut_val *patch,yyjson_patch_err *err)

{
  char **ppcVar1;
  char cVar2;
  yyjson_ptr_code yVar3;
  ulong uVar4;
  yyjson_val *op;
  patch_op pVar5;
  int iVar6;
  size_t len;
  yyjson_mut_val *pyVar7;
  ulong uVar8;
  ulong *puVar9;
  yyjson_mut_val *pyVar10;
  char *pcVar11;
  ulong uVar12;
  ulong *puVar13;
  size_t ptr_len;
  yyjson_mut_val *val;
  ulong *puVar14;
  ulong uVar15;
  ulong *puVar16;
  size_t len_1;
  yyjson_ptr_err *err_00;
  ulong uVar17;
  yyjson_mut_val *val_00;
  bool bVar18;
  yyjson_ptr_code local_bc;
  char *local_a8;
  yyjson_patch_err err_tmp;
  
  if (err == (yyjson_patch_err *)0x0) {
    err = &err_tmp;
    err_00 = &err_tmp.ptr;
  }
  else {
    err_00 = &err->ptr;
  }
  (err->ptr).msg = (char *)0x0;
  (err->ptr).pos = 0;
  err->msg = (char *)0x0;
  *(undefined8 *)&err->ptr = 0;
  *(undefined8 *)err = 0;
  err->idx = 0;
  if (((doc == (yyjson_mut_doc *)0x0) || (orig == (yyjson_mut_val *)0x0)) ||
     (patch == (yyjson_mut_val *)0x0)) {
    if ((err->ptr).code != 6) {
      err->code = 1;
      pcVar11 = "input parameter is NULL";
LAB_01f39492:
      err->msg = pcVar11;
LAB_01f39496:
      err->idx = 0;
      return (yyjson_mut_val *)0x0;
    }
    err->code = 2;
    pcVar11 = "input parameter is NULL";
  }
  else {
    if ((patch->tag & 7) == 6) {
      pyVar7 = yyjson_mut_val_mut_copy(doc,orig);
      if (pyVar7 != (yyjson_mut_val *)0x0) {
        uVar4 = patch->tag;
        uVar8 = 0;
        puVar14 = (ulong *)0x0;
        if (0xff < uVar4 && ((uint)uVar4 & 7) == 6) {
          uVar8 = uVar4 >> 8;
          puVar14 = (ulong *)(patch->uni).u64;
        }
        ppcVar1 = &err_00->msg;
        local_a8 = "input parameter is NULL";
        local_bc = 1;
        uVar4 = 0;
        do {
          val_00 = pyVar7;
          uVar12 = uVar4;
          if (uVar12 == uVar8) {
            return val_00;
          }
          puVar14 = (ulong *)puVar14[2];
          if (puVar14 == (ulong *)0x0) {
            return val_00;
          }
          uVar17 = *puVar14;
          if ((~(uint)uVar17 & 7) != 0) {
            if ((err->ptr).code != 6) {
              err->code = 3;
              pcVar11 = "JSON patch operation is not object";
              goto LAB_01f39388;
            }
            err->code = 2;
            pcVar11 = "JSON patch operation is not object";
            goto LAB_01f39365;
          }
          if (uVar17 < 0x100) {
LAB_01f3932e:
            if ((err->ptr).code != 6) {
              err->code = 4;
              pcVar11 = "missing key `op`";
LAB_01f39388:
              err->msg = pcVar11;
              err->idx = uVar12;
              return (yyjson_mut_val *)0x0;
            }
            err->code = 2;
            pcVar11 = "missing key `op`";
            goto LAB_01f39365;
          }
          uVar4 = uVar12 + 1;
          uVar17 = uVar17 >> 8;
          puVar16 = (ulong *)puVar14[1];
          puVar13 = puVar16;
          uVar15 = uVar17;
          do {
            bVar18 = uVar15 == 0;
            uVar15 = uVar15 - 1;
            if (bVar18) goto LAB_01f3932e;
            puVar13 = *(ulong **)(puVar13[2] + 0x10);
          } while (((*puVar13 & 0xffffffffffffff00) != 0x200) || (*(short *)puVar13[1] != 0x706f));
          op = (yyjson_val *)puVar13[2];
          if (op == (yyjson_val *)0x0) goto LAB_01f3932e;
          if ((op->tag & 7) != 5) {
            if ((err->ptr).code != 6) {
              err->code = 5;
              pcVar11 = "invalid member `op`";
              goto LAB_01f39388;
            }
            err->code = 2;
            pcVar11 = "invalid member `op`";
            goto LAB_01f39365;
          }
          pVar5 = patch_op_get(op);
          uVar15 = uVar17;
          puVar13 = puVar16;
          do {
            bVar18 = uVar15 == 0;
            uVar15 = uVar15 - 1;
            if (bVar18) goto LAB_01f39352;
            puVar13 = *(ulong **)(puVar13[2] + 0x10);
          } while (((*puVar13 & 0xffffffffffffff00) != 0x400) || (*(int *)puVar13[1] != 0x68746170))
          ;
          puVar13 = (ulong *)puVar13[2];
          if (puVar13 == (ulong *)0x0) {
LAB_01f39352:
            if ((err->ptr).code != 6) {
              err->code = 4;
              pcVar11 = "missing key `path`";
              goto LAB_01f39388;
            }
            err->code = 2;
            pcVar11 = "missing key `path`";
            goto LAB_01f39365;
          }
          uVar15 = *puVar13;
          if (((uint)uVar15 & 7) != 5) {
            if ((err->ptr).code != 6) {
              err->code = 5;
              pcVar11 = "invalid member `path`";
              goto LAB_01f39388;
            }
            err->code = 2;
            pcVar11 = "invalid member `path`";
            goto LAB_01f39365;
          }
          if (pVar5 < PATCH_OP_NONE) {
            if ((0x25U >> (pVar5 & 0x1f) & 1) != 0) {
              do {
                bVar18 = uVar17 == 0;
                uVar17 = uVar17 - 1;
                if (bVar18) goto LAB_01f393a4;
                puVar16 = *(ulong **)(puVar16[2] + 0x10);
              } while (((*puVar16 & 0xffffffffffffff00) != 0x500) ||
                      (iVar6 = bcmp((void *)puVar16[1],"value",5), iVar6 != 0));
              if ((yyjson_mut_val *)puVar16[2] != (yyjson_mut_val *)0x0) {
                pyVar7 = yyjson_mut_val_mut_copy(doc,(yyjson_mut_val *)puVar16[2]);
                if (pyVar7 != (yyjson_mut_val *)0x0) {
                  puVar9 = (ulong *)0x0;
                  ptr_len = 0;
                  goto LAB_01f38f1b;
                }
LAB_01f3951e:
                yVar3 = (err->ptr).code;
                err->code = 2;
                err->msg = "failed to copy value";
                if (yVar3 == 6) goto LAB_01f39369;
                goto LAB_01f39412;
              }
LAB_01f393a4:
              if ((err->ptr).code != 6) {
                err->code = 4;
                pcVar11 = "missing key `value`";
                goto LAB_01f39388;
              }
              err->code = 2;
              pcVar11 = "missing key `value`";
              goto LAB_01f39365;
            }
            puVar9 = (ulong *)0x0;
            pyVar7 = (yyjson_mut_val *)0x0;
            ptr_len = 0;
            if ((0x18U >> (pVar5 & 0x1f) & 1) != 0) {
              do {
                bVar18 = uVar17 == 0;
                uVar17 = uVar17 - 1;
                if (bVar18) goto LAB_01f393ce;
                puVar16 = *(ulong **)(puVar16[2] + 0x10);
              } while (((*puVar16 & 0xffffffffffffff00) != 0x400) ||
                      (*(int *)puVar16[1] != 0x6d6f7266));
              puVar9 = (ulong *)puVar16[2];
              if (puVar9 != (ulong *)0x0) {
                if (((uint)*puVar9 & 7) == 5) {
                  ptr_len = *puVar9 >> 8;
                  pyVar7 = (yyjson_mut_val *)0x0;
                  goto LAB_01f38f1b;
                }
                if ((err->ptr).code == 6) {
                  err->code = 2;
                  pcVar11 = "invalid member `from`";
                  goto LAB_01f39365;
                }
                err->code = 5;
                pcVar11 = "invalid member `from`";
                goto LAB_01f3940e;
              }
LAB_01f393ce:
              if ((err->ptr).code == 6) {
                err->code = 2;
                pcVar11 = "missing key `from`";
                goto LAB_01f39365;
              }
              err->code = 4;
              pcVar11 = "missing key `from`";
              goto LAB_01f3940e;
            }
          }
          else {
            puVar9 = (ulong *)0x0;
            pyVar7 = (yyjson_mut_val *)0x0;
            ptr_len = 0;
          }
LAB_01f38f1b:
          if (PATCH_OP_TEST < pVar5) {
            if ((err->ptr).code == 6) {
              err->code = 2;
              pcVar11 = "unsupported `op`";
              goto LAB_01f39365;
            }
            err->code = 5;
            pcVar11 = "unsupported `op`";
            goto LAB_01f3940e;
          }
          uVar17 = uVar15 >> 8;
          switch(pVar5) {
          case PATCH_OP_ADD:
            if (0xff < uVar15) {
              pcVar11 = (char *)puVar13[1];
              (err->ptr).code = 0;
              *ppcVar1 = (char *)0x0;
              err_00->pos = 0;
              if (((pyVar7 == (yyjson_mut_val *)0x0) || (val_00 == (yyjson_mut_val *)0x0)) ||
                 (pcVar11 == (char *)0x0)) {
LAB_01f39551:
                (err->ptr).code = local_bc;
                err_00->msg = local_a8;
                err_00->pos = 0;
              }
              else {
                cVar2 = *pcVar11;
joined_r0x01f391d6:
                if (cVar2 != '/') {
LAB_01f3953e:
                  local_bc = 2;
                  local_a8 = "no prefix \'/\'";
                  goto LAB_01f39551;
                }
                bVar18 = unsafe_yyjson_mut_ptr_putx
                                   (val_00,pcVar11,uVar17,pyVar7,doc,false,true,
                                    (yyjson_ptr_ctx *)0x0,err_00);
LAB_01f39211:
                pyVar7 = val_00;
                if (bVar18 != false) break;
                if ((err->ptr).code == 6) {
                  err->code = 2;
                  pcVar11 = "failed to add `path`";
                  goto LAB_01f39365;
                }
              }
              err->code = 7;
              pcVar11 = "failed to add `path`";
              goto LAB_01f3940e;
            }
            break;
          case PATCH_OP_REMOVE:
            pcVar11 = (char *)puVar13[1];
            (err->ptr).code = 0;
            *ppcVar1 = (char *)0x0;
            err_00->pos = 0;
            if ((val_00 == (yyjson_mut_val *)0x0) || (pcVar11 == (char *)0x0)) {
LAB_01f3968f:
              (err->ptr).code = local_bc;
              err_00->msg = local_a8;
              err_00->pos = 0;
            }
            else {
              if (uVar15 < 0x100) {
                local_bc = 5;
                local_a8 = "cannot set root";
                goto LAB_01f3968f;
              }
              if (*pcVar11 != '/') {
                local_bc = 2;
                local_a8 = "no prefix \'/\'";
                goto LAB_01f3968f;
              }
              pyVar10 = unsafe_yyjson_mut_ptr_removex
                                  (val_00,pcVar11,uVar17,(yyjson_ptr_ctx *)0x0,err_00);
              pyVar7 = val_00;
              if (pyVar10 != (yyjson_mut_val *)0x0) break;
              if ((err->ptr).code == 6) {
                err->code = 2;
                pcVar11 = "failed to remove `path`";
                goto LAB_01f39365;
              }
            }
            err->code = 7;
            pcVar11 = "failed to remove `path`";
            goto LAB_01f3940e;
          case PATCH_OP_REPLACE:
            if (0xff < uVar15) {
              pcVar11 = (char *)puVar13[1];
              (err->ptr).code = 0;
              *ppcVar1 = (char *)0x0;
              err_00->pos = 0;
              if (((pyVar7 == (yyjson_mut_val *)0x0) || (val_00 == (yyjson_mut_val *)0x0)) ||
                 (pcVar11 == (char *)0x0)) {
LAB_01f39650:
                (err->ptr).code = local_bc;
                err_00->msg = local_a8;
                err_00->pos = 0;
              }
              else {
                if (*pcVar11 != '/') {
                  local_bc = 2;
                  local_a8 = "no prefix \'/\'";
                  goto LAB_01f39650;
                }
                pyVar10 = unsafe_yyjson_mut_ptr_replacex
                                    (val_00,pcVar11,uVar17,pyVar7,(yyjson_ptr_ctx *)0x0,err_00);
                pyVar7 = val_00;
                if (pyVar10 != (yyjson_mut_val *)0x0) break;
                if ((err->ptr).code == 6) {
                  err->code = 2;
                  pcVar11 = "failed to replace `path`";
                  goto LAB_01f39365;
                }
              }
              err->code = 7;
              pcVar11 = "failed to replace `path`";
              goto LAB_01f3940e;
            }
            break;
          case PATCH_OP_MOVE:
            pyVar7 = val_00;
            if (ptr_len != 0 || uVar17 != 0) {
              pcVar11 = (char *)puVar9[1];
              (err->ptr).code = 0;
              *ppcVar1 = (char *)0x0;
              err_00->pos = 0;
              if ((val_00 == (yyjson_mut_val *)0x0) || (pcVar11 == (char *)0x0)) {
LAB_01f396ce:
                (err->ptr).code = local_bc;
                err_00->msg = local_a8;
                err_00->pos = 0;
              }
              else {
                if (ptr_len == 0) {
                  local_bc = 5;
                  local_a8 = "cannot set root";
                  goto LAB_01f396ce;
                }
                if (*pcVar11 != '/') {
                  local_bc = 2;
                  local_a8 = "no prefix \'/\'";
                  goto LAB_01f396ce;
                }
                pyVar7 = unsafe_yyjson_mut_ptr_removex
                                   (val_00,pcVar11,ptr_len,(yyjson_ptr_ctx *)0x0,err_00);
                if (pyVar7 != (yyjson_mut_val *)0x0) {
                  if (0xff < uVar15) {
                    pcVar11 = (char *)puVar13[1];
                    (err->ptr).code = 0;
                    *ppcVar1 = (char *)0x0;
                    err_00->pos = 0;
                    if (pcVar11 != (char *)0x0) {
                      cVar2 = *pcVar11;
                      goto joined_r0x01f391d6;
                    }
                    goto LAB_01f39551;
                  }
                  break;
                }
                if ((err->ptr).code == 6) {
                  err->code = 2;
                  pcVar11 = "failed to remove `from`";
                  goto LAB_01f39365;
                }
              }
              err->code = 7;
              pcVar11 = "failed to remove `from`";
              goto LAB_01f3940e;
            }
            break;
          case PATCH_OP_COPY:
            pcVar11 = (char *)puVar9[1];
            (err->ptr).code = 0;
            *ppcVar1 = (char *)0x0;
            err_00->pos = 0;
            if ((val_00 == (yyjson_mut_val *)0x0) || (pcVar11 == (char *)0x0)) {
LAB_01f395fe:
              (err->ptr).code = local_bc;
              err_00->msg = local_a8;
              err_00->pos = 0;
            }
            else {
              pyVar7 = val_00;
              if (ptr_len == 0) {
LAB_01f3900a:
                if (0xff < uVar15) {
                  pyVar7 = yyjson_mut_val_mut_copy(doc,pyVar7);
                  if (pyVar7 == (yyjson_mut_val *)0x0) goto LAB_01f3951e;
                  pcVar11 = (char *)puVar13[1];
                  (err->ptr).code = 0;
                  *ppcVar1 = (char *)0x0;
                  err_00->pos = 0;
                  if (pcVar11 != (char *)0x0) {
                    if (*pcVar11 != '/') goto LAB_01f3953e;
                    bVar18 = unsafe_yyjson_mut_ptr_putx
                                       (val_00,pcVar11,uVar17,pyVar7,doc,false,true,
                                        (yyjson_ptr_ctx *)0x0,err_00);
                    goto LAB_01f39211;
                  }
                  goto LAB_01f39551;
                }
                break;
              }
              if (*pcVar11 != '/') {
                local_bc = 2;
                local_a8 = "no prefix \'/\'";
                goto LAB_01f395fe;
              }
              pyVar7 = unsafe_yyjson_mut_ptr_getx
                                 (val_00,pcVar11,ptr_len,(yyjson_ptr_ctx *)0x0,err_00);
              if (pyVar7 != (yyjson_mut_val *)0x0) goto LAB_01f3900a;
              if ((err->ptr).code == 6) {
                err->code = 2;
                pcVar11 = "failed to get `from`";
                goto LAB_01f39365;
              }
            }
            err->code = 7;
            pcVar11 = "failed to get `from`";
            goto LAB_01f3940e;
          case PATCH_OP_TEST:
            pcVar11 = (char *)puVar13[1];
            (err->ptr).code = 0;
            *ppcVar1 = (char *)0x0;
            err_00->pos = 0;
            if ((val_00 == (yyjson_mut_val *)0x0) || (pcVar11 == (char *)0x0)) {
LAB_01f395bf:
              (err->ptr).code = local_bc;
              err_00->msg = local_a8;
              err_00->pos = 0;
LAB_01f395d9:
              err->code = 7;
              pcVar11 = "failed to get `path`";
              goto LAB_01f3940e;
            }
            pyVar10 = val_00;
            if (0xff < uVar15) {
              if (*pcVar11 != '/') {
                local_bc = 2;
                local_a8 = "no prefix \'/\'";
                goto LAB_01f395bf;
              }
              pyVar10 = unsafe_yyjson_mut_ptr_getx
                                  (val_00,pcVar11,uVar17,(yyjson_ptr_ctx *)0x0,err_00);
              if (pyVar10 != (yyjson_mut_val *)0x0) goto LAB_01f392ee;
              if ((err->ptr).code != 6) goto LAB_01f395d9;
              err->code = 2;
              pcVar11 = "failed to get `path`";
              goto LAB_01f39365;
            }
LAB_01f392ee:
            if ((pyVar7 == (yyjson_mut_val *)0x0) ||
               (bVar18 = unsafe_yyjson_mut_equals(pyVar7,pyVar10), pyVar7 = val_00, !bVar18)) {
              if ((err->ptr).code == 6) {
                err->code = 2;
                pcVar11 = "failed to test equal";
LAB_01f39365:
                err->msg = pcVar11;
LAB_01f39369:
                *(undefined8 *)err_00 = 0;
                err_00->msg = (char *)0x0;
                err_00->pos = 0;
                return (yyjson_mut_val *)0x0;
              }
              err->code = 6;
              pcVar11 = "failed to test equal";
LAB_01f3940e:
              err->msg = pcVar11;
LAB_01f39412:
              err->idx = uVar12;
              return (yyjson_mut_val *)0x0;
            }
          }
        } while( true );
      }
      yVar3 = (err->ptr).code;
      err->code = 2;
      err->msg = "failed to copy value";
      if (yVar3 != 6) goto LAB_01f39496;
      goto LAB_01f39468;
    }
    if ((err->ptr).code != 6) {
      err->code = 1;
      pcVar11 = "input patch is not array";
      goto LAB_01f39492;
    }
    err->code = 2;
    pcVar11 = "input patch is not array";
  }
  err->msg = pcVar11;
LAB_01f39468:
  *(undefined8 *)err_00 = 0;
  err_00->msg = (char *)0x0;
  err_00->pos = 0;
  return (yyjson_mut_val *)0x0;
}

Assistant:

yyjson_mut_val *yyjson_mut_patch(yyjson_mut_doc *doc,
                                 yyjson_mut_val *orig,
                                 yyjson_mut_val *patch,
                                 yyjson_patch_err *err) {
    yyjson_mut_val *root, *obj;
    yyjson_mut_arr_iter iter;
    yyjson_patch_err err_tmp;
    if (!err) err = &err_tmp;
    memset(err, 0, sizeof(*err));
    memset(&iter, 0, sizeof(iter));

    if (unlikely(!doc || !orig || !patch)) {
        return_err(INVALID_PARAMETER, "input parameter is NULL");
    }
    if (unlikely(!yyjson_mut_is_arr(patch))) {
        return_err(INVALID_PARAMETER, "input patch is not array");
    }
    root = yyjson_mut_val_mut_copy(doc, orig);
    if (unlikely(!root)) return_err_copy();

    /* iterate through the patch array */
    yyjson_mut_arr_iter_init(patch, &iter);
    while ((obj = yyjson_mut_arr_iter_next(&iter))) {
        patch_op op_enum;
        yyjson_mut_val *op, *path, *from = NULL, *value;
        yyjson_mut_val *val = NULL, *test;
        usize path_len, from_len = 0;
        if (!unsafe_yyjson_is_obj(obj)) {
            return_err(INVALID_OPERATION, "JSON patch operation is not object");
        }

        /* get required member: op */
        op = yyjson_mut_obj_get(obj, "op");
        if (unlikely(!op)) return_err_key("`op`");
        if (unlikely(!yyjson_mut_is_str(op))) return_err_val("`op`");
        op_enum = patch_op_get((yyjson_val *)(void *)op);

        /* get required member: path */
        path = yyjson_mut_obj_get(obj, "path");
        if (unlikely(!path)) return_err_key("`path`");
        if (unlikely(!yyjson_mut_is_str(path))) return_err_val("`path`");
        path_len = unsafe_yyjson_get_len(path);

        /* get required member: value, from */
        switch ((int)op_enum) {
            case PATCH_OP_ADD: case PATCH_OP_REPLACE: case PATCH_OP_TEST:
                value = yyjson_mut_obj_get(obj, "value");
                if (unlikely(!value)) return_err_key("`value`");
                val = yyjson_mut_val_mut_copy(doc, value);
                if (unlikely(!val)) return_err_copy();
                break;
            case PATCH_OP_MOVE: case PATCH_OP_COPY:
                from = yyjson_mut_obj_get(obj, "from");
                if (unlikely(!from)) return_err_key("`from`");
                if (unlikely(!yyjson_mut_is_str(from))) {
                    return_err_val("`from`");
                }
                from_len = unsafe_yyjson_get_len(from);
                break;
            default:
                break;
        }

        /* perform an operation */
        switch ((int)op_enum) {
            case PATCH_OP_ADD: /* add(path, val) */
                if (unlikely(path_len == 0)) { root = val; break; }
                if (unlikely(!ptr_add(path, val))) {
                    return_err(POINTER, "failed to add `path`");
                }
                break;
            case PATCH_OP_REMOVE: /* remove(path) */
                if (unlikely(!ptr_remove(path))) {
                    return_err(POINTER, "failed to remove `path`");
                }
                break;
            case PATCH_OP_REPLACE: /* replace(path, val) */
                if (unlikely(path_len == 0)) { root = val; break; }
                if (unlikely(!ptr_replace(path, val))) {
                    return_err(POINTER, "failed to replace `path`");
                }
                break;
            case PATCH_OP_MOVE: /* val = remove(from), add(path, val) */
                if (unlikely(from_len == 0 && path_len == 0)) break;
                val = ptr_remove(from);
                if (unlikely(!val)) {
                    return_err(POINTER, "failed to remove `from`");
                }
                if (unlikely(path_len == 0)) { root = val; break; }
                if (unlikely(!ptr_add(path, val))) {
                    return_err(POINTER, "failed to add `path`");
                }
                break;
            case PATCH_OP_COPY: /* val = get(from).copy, add(path, val) */
                val = ptr_get(from);
                if (unlikely(!val)) {
                    return_err(POINTER, "failed to get `from`");
                }
                if (unlikely(path_len == 0)) { root = val; break; }
                val = yyjson_mut_val_mut_copy(doc, val);
                if (unlikely(!val)) return_err_copy();
                if (unlikely(!ptr_add(path, val))) {
                    return_err(POINTER, "failed to add `path`");
                }
                break;
            case PATCH_OP_TEST: /* test = get(path), test.eq(val) */
                test = ptr_get(path);
                if (unlikely(!test)) {
                    return_err(POINTER, "failed to get `path`");
                }
                if (unlikely(!yyjson_mut_equals(val, test))) {
                    return_err(EQUAL, "failed to test equal");
                }
                break;
            default:
                return_err(INVALID_MEMBER, "unsupported `op`");
        }
    }
    return root;
}